

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O3

event_set * __thiscall
afsm::detail::
state_machine_base_impl<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
::current_handled_events
          (event_set *__return_storage_ptr__,
          state_machine_base_impl<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *this)

{
  event_set *peVar1;
  
  peVar1 = state_base_impl<afsm::test::outer_machine,_false>::internal_handled_events();
  transitions::
  state_transition_table<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
  ::current_handled_events
            (__return_storage_ptr__,
             (state_transition_table<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
              *)this);
  std::
  _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<afsm::detail::event_base::id_type_const*>>
            ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)__return_storage_ptr__,
             (peVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<const_afsm::detail::event_base::id_type_*>)
             &(peVar1->_M_t)._M_impl.super__Rb_tree_header);
  return __return_storage_ptr__;
}

Assistant:

event_set
    current_handled_events() const
    {
        auto const& intl = state_type::internal_handled_events();
        auto res = transitions_.current_handled_events();
        res.insert(intl.begin(), intl.end());
        return res;
    }